

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_fourier_transform.cc
# Opt level: O3

bool __thiscall
sptk::DiscreteFourierTransform::Run
          (DiscreteFourierTransform *this,vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  bool bVar10;
  long lVar11;
  size_type __new_size;
  ulong uVar12;
  uint uVar13;
  pointer pdVar14;
  ulong uVar15;
  int n;
  ulong uVar16;
  double dVar17;
  double dVar18;
  
  if (this->is_valid_ == true) {
    lVar11 = (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    uVar13 = this->dft_length_;
    __new_size = (size_type)(int)uVar13;
    if (lVar11 >> 3 == __new_size) {
      bVar10 = false;
      if (((imag_part_output != (vector<double,_std::allocator<double>_> *)0x0) &&
          (bVar10 = false, real_part_output != (vector<double,_std::allocator<double>_> *)0x0)) &&
         ((long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start == lVar11)) {
        if ((long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start != lVar11) {
          std::vector<double,_std::allocator<double>_>::resize(real_part_output,lVar11 >> 3);
          uVar13 = this->dft_length_;
          __new_size = (size_type)(int)uVar13;
        }
        pdVar14 = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((long)(imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar14 >> 3 != __new_size) {
          std::vector<double,_std::allocator<double>_>::resize(imag_part_output,__new_size);
          pdVar14 = (imag_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar13 = this->dft_length_;
        }
        bVar10 = true;
        if (0 < (int)uVar13) {
          pdVar5 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar6 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar7 = (real_part_output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar9 = (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          uVar15 = 0;
          do {
            dVar17 = 0.0;
            dVar18 = 0.0;
            uVar12 = 0;
            uVar16 = 0;
            do {
              dVar1 = pdVar6[uVar16];
              dVar2 = pdVar9[uVar12 % (ulong)uVar13];
              dVar3 = pdVar8[uVar12 % (ulong)uVar13];
              dVar4 = pdVar5[uVar16];
              dVar17 = dVar17 + dVar2 * dVar4 + -dVar1 * dVar3;
              dVar18 = dVar18 + dVar3 * dVar4 + dVar1 * dVar2;
              uVar16 = uVar16 + 1;
              uVar12 = (ulong)(uint)((int)uVar12 + (int)uVar15);
            } while (uVar13 != uVar16);
            pdVar7[uVar15] = dVar17;
            pdVar14[uVar15] = dVar18;
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar13);
        }
      }
    }
    else {
      bVar10 = false;
    }
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool DiscreteFourierTransform::Run(
    const std::vector<double>& real_part_input,
    const std::vector<double>& imag_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output) const {
  // Check inputs
  if (!is_valid_ ||
      real_part_input.size() != static_cast<std::size_t>(dft_length_) ||
      imag_part_input.size() != static_cast<std::size_t>(dft_length_) ||
      NULL == real_part_output || NULL == imag_part_output) {
    return false;
  }

  // Prepare memories.
  if (real_part_output->size() != static_cast<std::size_t>(dft_length_)) {
    real_part_output->resize(dft_length_);
  }
  if (imag_part_output->size() != static_cast<std::size_t>(dft_length_)) {
    imag_part_output->resize(dft_length_);
  }

  const double* input_x(&(real_part_input[0]));
  const double* input_y(&(imag_part_input[0]));
  double* output_x(&((*real_part_output)[0]));
  double* output_y(&((*imag_part_output)[0]));

  for (int k(0); k < dft_length_; ++k) {
    double sum_x(0.0);
    double sum_y(0.0);
    for (int n(0); n < dft_length_; ++n) {
      const int index(k * n % dft_length_);
      sum_x +=
          input_x[n] * cosine_table_[index] - input_y[n] * sine_table_[index];
      sum_y +=
          input_x[n] * sine_table_[index] + input_y[n] * cosine_table_[index];
    }
    output_x[k] = sum_x;
    output_y[k] = sum_y;
  }

  return true;
}